

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O1

bool __thiscall mpt::buffer::trim(buffer *this,size_t len)

{
  ulong uVar1;
  type_traits *ptVar2;
  ulong uVar3;
  _func_void_void_ptr *p_Var4;
  bool bVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = this->_used;
  uVar8 = uVar1 - len;
  if (uVar1 < len) {
LAB_0012a9f9:
    bVar5 = false;
  }
  else {
    ptVar2 = this->_content_traits;
    if (ptVar2 != (type_traits *)0x0) {
      uVar3 = ptVar2->size;
      if (uVar3 == 0) goto LAB_0012a9f9;
      if (uVar1 % uVar3 != 0) {
        return false;
      }
      if (uVar8 % uVar3 != 0) {
        return false;
      }
      p_Var4 = ptVar2->fini;
      if ((p_Var4 != (_func_void_void_ptr *)0x0) && (uVar8 < uVar1)) {
        pvVar6 = (void *)((long)this + uVar1 * 2 + len * -2 + 0x20);
        uVar7 = uVar8;
        do {
          (*p_Var4)(pvVar6);
          uVar7 = uVar7 + uVar3;
          pvVar6 = (void *)((long)pvVar6 + uVar3);
        } while (uVar7 < uVar1);
      }
    }
    this->_used = uVar8;
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool buffer::trim(size_t len)
{
	if (_used < len) {
		return false;
	}
	size_t used = _used;
	len = used - len;
	const struct type_traits *traits = content_traits();
	if (traits) {
		size_t size;
		if (!(size = traits->size)
		 || used % size
		 || len % size) {
			return false;
		}
		void (*fini)(void *);
		if ((fini = traits->fini)) {
			uint8_t *base = static_cast<uint8_t *>(static_cast<void *>(this + 1)) + len;
			for (size_t i = len; i < used; i += size) {
				fini(base + i);
			}
		}
	}
	_used = len;
	return true;
}